

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qringbuffer.cpp
# Opt level: O2

qint64 __thiscall QRingBuffer::peek(QRingBuffer *this,char *data,qint64 maxLength,qint64 pos)

{
  QRingChunk *pQVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  size_t __n;
  QRingChunk *pQVar7;
  long lVar8;
  long lVar9;
  
  pQVar1 = (this->buffers).d.ptr;
  lVar2 = (this->buffers).d.size;
  lVar8 = 0;
  lVar9 = 0;
  pQVar7 = pQVar1;
  while ((lVar2 * 0x28 - lVar8 != 0 && (sVar5 = maxLength - lVar9, sVar5 != 0))) {
    lVar6 = pQVar7->tailOffset - pQVar7->headOffset;
    lVar3 = pos - lVar6;
    if (pos < lVar6) {
      __n = lVar6 - pos;
      if ((long)sVar5 <= lVar6 - pos) {
        __n = sVar5;
      }
      pcVar4 = *(char **)((long)&(pQVar1->chunk).d.ptr + lVar8);
      if (pcVar4 == (char *)0x0) {
        pcVar4 = "";
      }
      memcpy(data + lVar9,pcVar4 + pQVar7->headOffset + pos,__n);
      lVar9 = lVar9 + __n;
      lVar3 = 0;
    }
    pQVar7 = pQVar7 + 1;
    lVar8 = lVar8 + 0x28;
    pos = lVar3;
  }
  return lVar9;
}

Assistant:

qint64 QRingBuffer::peek(char *data, qint64 maxLength, qint64 pos) const
{
    Q_ASSERT(maxLength >= 0 && pos >= 0);

    qint64 readSoFar = 0;
    for (const QRingChunk &chunk : buffers) {
        if (readSoFar == maxLength)
            break;

        qint64 blockLength = chunk.size();
        if (pos < blockLength) {
            blockLength = qMin(blockLength - pos, maxLength - readSoFar);
            memcpy(data + readSoFar, chunk.data() + pos, blockLength);
            readSoFar += blockLength;
            pos = 0;
        } else {
            pos -= blockLength;
        }
    }

    return readSoFar;
}